

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RequiresMixedFlags_Test::TestBody(TApp_RequiresMixedFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  allocator local_41c;
  allocator local_41b;
  allocator local_41a;
  allocator local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  iterator local_390;
  size_type local_388;
  AssertHelper local_380;
  Message local_378 [2];
  RequiresError *anon_var_0_2;
  char *pcStack_360;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328 [32];
  string local_308 [32];
  iterator local_2e8;
  size_type local_2e0;
  AssertHelper local_2d8;
  Message local_2d0 [2];
  RequiresError *anon_var_0_1;
  char *pcStack_2b8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280 [32];
  iterator local_260;
  size_type local_258;
  AssertHelper local_250;
  Message local_248 [2];
  RequiresError *anon_var_0;
  char *pcStack_230;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  iterator local_1f8;
  size_type local_1f0;
  undefined1 local_1e2;
  allocator local_1e1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  iterator local_1b8;
  size_type local_1b0;
  undefined1 local_1a2;
  allocator local_1a1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  iterator local_178;
  size_type local_170;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt1;
  TApp_RequiresMixedFlags_Test *this_local;
  
  opt1 = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--opt1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--opt2",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"--opt3",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"",&local_111);
  CLI::App::add_flag(&(this->super_TApp).app,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"--optall",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"",&local_161);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_138,&local_160);
  CLI::Option::requires<CLI::Option*,char_const*,char_const*>(pOVar2,local_18,"--opt2","--opt3");
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1a2 = '\x01';
  local_1a1._1_8_ = &local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"--opt1",local_1a1);
  local_1a2 = '\0';
  local_178 = &local_198;
  local_170 = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_178;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_04);
  local_4b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_4b0 = local_4b0 + -1;
    std::__cxx11::string::~string((string *)local_4b0);
  } while (local_4b0 != &local_198);
  std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1e2 = '\x01';
  local_1e1._1_8_ = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"--opt2",local_1e1);
  local_1e2 = '\0';
  local_1b8 = &local_1d8;
  local_1b0 = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_1b8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_4d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8;
  do {
    local_4d8 = local_4d8 + -1;
    std::__cxx11::string::~string((string *)local_4d8);
  } while (local_4d8 != &local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)local_1e1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_218,"--optall",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_1f8 = &local_218;
  local_1f0 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_1f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8;
  do {
    local_500 = local_500 + -1;
    std::__cxx11::string::~string((string *)local_500);
  } while (local_500 != &local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdd0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdd0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_230 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_001494df;
    }
  }
  else {
LAB_001494df:
    testing::Message::Message(local_248);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x44f,pcStack_230);
    testing::internal::AssertHelper::operator=(&local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(local_248);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2a0,"--optall",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"--opt1",(allocator *)((long)&gtest_msg_1.value + 6));
  gtest_msg_1.value._5_1_ = 0;
  local_260 = &local_2a0;
  local_258 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_260;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_5b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260;
  do {
    local_5b8 = local_5b8 + -1;
    std::__cxx11::string::~string((string *)local_5b8);
  } while (local_5b8 != &local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd48,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd48);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_2b8 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_00149880;
    }
  }
  else {
LAB_00149880:
    testing::Message::Message(local_2d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x453,pcStack_2b8);
    testing::internal::AssertHelper::operator=(&local_2d8,local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(local_2d0);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_2.value._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_348,"--optall",(allocator *)((long)&gtest_msg_2.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"--opt2",(allocator *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"--opt1",(allocator *)((long)&gtest_msg_2.value + 5));
  gtest_msg_2.value._4_1_ = 0;
  local_2e8 = &local_348;
  local_2e0 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_2e8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_630 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e8;
  do {
    local_630 = local_630 + -1;
    std::__cxx11::string::~string((string *)local_630);
  } while (local_630 != &local_348);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffca0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffca0);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) goto LAB_00149d26;
    pcStack_360 = 
    "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_378);
  testing::internal::AssertHelper::AssertHelper
            (&local_380,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x457,pcStack_360);
  testing::internal::AssertHelper::operator=(&local_380,local_378);
  testing::internal::AssertHelper::~AssertHelper(&local_380);
  testing::Message::~Message(local_378);
LAB_00149d26:
  CLI::App::reset(&(this->super_TApp).app);
  local_418 = &local_410;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"--optall",&local_419);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"--opt1",&local_41a);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"--opt2",&local_41b);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"--opt3",&local_41c);
  local_390 = &local_410;
  local_388 = 4;
  __l._M_len = 4;
  __l._M_array = local_390;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_390;
  do {
    local_6b8 = local_6b8 + -1;
    std::__cxx11::string::~string((string *)local_6b8);
  } while (local_6b8 != &local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_41c);
  std::allocator<char>::~allocator((allocator<char> *)&local_41b);
  std::allocator<char>::~allocator((allocator<char> *)&local_41a);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiresMixedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    app.add_flag("--opt2");
    app.add_flag("--opt3");
    app.add_flag("--optall")->requires(opt1, "--opt2", "--opt3");

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--optall"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt2", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1", "--opt2", "--opt3"};
    run();
}